

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void inspect_serialized_object
               (FILE *serialized_bytes,bool *is_isotree_model,bool *is_compatible,
               bool *has_combined_objects,bool *has_IsoForest,bool *has_ExtIsoForest,
               bool *has_Imputer,bool *has_Indexer,bool *has_metadata,size_t *size_metadata)

{
  bool ignored [5];
  FILE *in;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  FILE *local_10;
  
  local_10 = serialized_bytes;
  inspect_serialized_object<_IO_FILE*>
            (&local_10,is_isotree_model,is_compatible,has_combined_objects,has_IsoForest,
             has_ExtIsoForest,has_Imputer,has_Indexer,has_metadata,size_metadata,&local_15,&local_14
             ,&local_13,&local_12,&local_11);
  return;
}

Assistant:

void inspect_serialized_object
(
    FILE *serialized_bytes,
    bool &is_isotree_model,
    bool &is_compatible,
    bool &has_combined_objects,
    bool &has_IsoForest,
    bool &has_ExtIsoForest,
    bool &has_Imputer,
    bool &has_Indexer,
    bool &has_metadata,
    size_t &size_metadata
)
{
    FILE *in = serialized_bytes;
    inspect_serialized_object<FILE*>(
        in,
        is_isotree_model,
        is_compatible,
        has_combined_objects,
        has_IsoForest,
        has_ExtIsoForest,
        has_Imputer,
        has_Indexer,
        has_metadata,
        size_metadata
    );
}